

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<google::protobuf::RepeatedFieldRef<std::__cxx11::string,void>,void>
               (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *container,ostream *os)

{
  bool bVar1;
  IteratorValueType local_a8;
  IteratorValueType *local_88;
  string *elem;
  undefined1 local_70 [8];
  iterator __end0;
  iterator __begin0;
  RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *container_local;
  
  std::operator<<(os,'{');
  __range3 = (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)0x0;
  google::protobuf::
  RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::begin((iterator *)&__end0.scratch_space_,container);
  google::protobuf::
  RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::end((iterator *)local_70,container);
  while (bVar1 = google::protobuf::internal::
                 RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=((RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&__end0.scratch_space_,
                              (RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_70), bVar1) {
    google::protobuf::internal::
    RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_a8,
                (RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__end0.scratch_space_);
    local_88 = &local_a8;
    if ((__range3 ==
         (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)0x0) ||
       (std::operator<<(os,','),
       __range3 !=
       (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *)0x20)) {
      std::operator<<(os,' ');
      UniversalPrint<std::__cxx11::string>(local_88,os);
      __range3 = (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)((long)&__range3->data_ + 1);
      elem._0_4_ = 0;
    }
    else {
      std::operator<<(os," ...");
      elem._0_4_ = 2;
    }
    std::__cxx11::string::~string((string *)&local_a8);
    if ((int)elem != 0) goto LAB_00d772b1;
    google::protobuf::internal::
    RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__end0.scratch_space_);
  }
  elem._0_4_ = 2;
LAB_00d772b1:
  google::protobuf::internal::
  RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedFieldRefIterator
            ((RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_70);
  google::protobuf::internal::
  RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedFieldRefIterator
            ((RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&__end0.scratch_space_);
  if (__range3 !=
      (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
       *)0x0) {
    std::operator<<(os,' ');
  }
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }